

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::backtrack
          (InstMatcher *this)

{
  TermList *pTVar1;
  
  pTVar1 = (this->_boundVars)._cursor;
  (this->_boundVars)._cursor = pTVar1 + -1;
  if (((uint)pTVar1[-1]._content & 3) != 2) {
    do {
      Lib::
      DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::remove((DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                *)&stack0xffffffffffffffc0,(char *)&this->_bindings);
      pTVar1 = (this->_boundVars)._cursor;
      (this->_boundVars)._cursor = pTVar1 + -1;
    } while (((uint)pTVar1[-1]._content & 3) != 2);
  }
  return;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastInstancesIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultDenormalizer.reset();
    bool ground = SubstitutionTree::isGround(ld->key());
    if(!ground) {
      Renaming normalizer;
      normalizer.normalizeVariables(ld->key());
      _resultDenormalizer.makeInverse(normalizer);
    }

    return QueryRes(_subst.getSubstitution(&_resultDenormalizer), ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}